

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O2

void czh::utils::fill_exponent(int K,string *buffer)

{
  ulong uVar1;
  ushort uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)K;
  if (K < 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (buffer,'-');
    uVar3 = (ulong)(uint)-K;
  }
  if ((uint)uVar3 < 100) {
    if ((uint)uVar3 < 10) goto LAB_0010ed33;
  }
  else {
    uVar1 = uVar3 / 100;
    uVar3 = uVar3 % 100;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (buffer,(char)uVar1 + '0');
  }
  uVar2 = (ushort)uVar3 & 0xff;
  uVar3 = (ulong)(byte)(uVar2 % 10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (buffer,(byte)(uVar2 / 10) | 0x30);
LAB_0010ed33:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (buffer,(byte)uVar3 | 0x30);
  return;
}

Assistant:

void fill_exponent(int K, std::string &buffer)
  {
    if (K < 0)
    {
      buffer += '-';
      K = -K;
    }
  
    if (K >= 100)
    {
      buffer += static_cast<char>(static_cast<int>('0') + K / 100);
      K %= 100;
      buffer += static_cast<char>(static_cast<int>('0') + K / 10);
      K %= 10;
      buffer += static_cast<char>(static_cast<int>('0') + K);
    }
    else if (K >= 10)
    {
      buffer += static_cast<char>(static_cast<int>('0') + K / 10);
      K %= 10;
      buffer += static_cast<char>(static_cast<int>('0') + K);
    }
    else
      buffer += static_cast<char>(static_cast<int>('0') + K);
  }